

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

hugeint_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>
          (Interpolator<false> *this,hugeint_t *v_t,Vector *result,
          MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t> *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>_>
  __comp_01;
  hugeint_t input;
  hugeint_t input_00;
  bool bVar3;
  idx_t iVar4;
  InvalidInputException *pIVar5;
  ulong uVar6;
  int64_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  hugeint_t hVar10;
  hugeint_t hVar11;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  hugeint_t result_1;
  uint64_t in_stack_ffffffffffffff80;
  _Alloc_hider _Var12;
  undefined7 uStack_67;
  hugeint_t local_58;
  hugeint_t local_48;
  
  bVar3 = this->desc;
  iVar9 = this->CRN;
  iVar4 = this->FRN;
  iVar1 = this->begin;
  iVar8 = this->end;
  if (iVar9 == iVar4) {
    if (iVar9 != iVar8 && iVar1 != iVar8) {
      uVar6 = (long)(iVar8 * 0x10 + iVar1 * -0x10) >> 4;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = uStack_67;
      __comp._M_comp.desc = bVar3;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar8,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar9 = this->FRN;
    }
    _Var12._M_p = (pointer)accessor->median->lower;
    hugeint_t::operator-(v_t + iVar9,(hugeint_t *)&stack0xffffffffffffff88);
    input.upper = (int64_t)_Var12._M_p;
    input.lower = in_stack_ffffffffffffff80;
    hVar10 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input);
    input_01.lower = hVar10.upper;
    iVar7 = 0;
    bVar3 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar10,&local_58,false);
    if (!bVar3) {
      pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.upper = iVar7;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                ((string *)&stack0xffffffffffffff88,(duckdb *)hVar10.lower,input_01);
      InvalidInputException::InvalidInputException(pIVar5,(string *)&stack0xffffffffffffff88);
      __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    hVar11.upper = local_58.upper;
    hVar11.lower = local_58.lower;
  }
  else {
    if (iVar4 != iVar8 && iVar1 != iVar8) {
      uVar6 = (long)(iVar8 * 0x10 + iVar1 * -0x10) >> 4;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = uStack_67;
      __comp_00._M_comp.desc = bVar3;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>>
                (v_t + iVar1,v_t + iVar4,v_t + iVar8,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar4 = this->FRN;
      iVar9 = this->CRN;
      iVar8 = this->end;
    }
    if (iVar9 != iVar8 && iVar4 != iVar8) {
      uVar6 = (long)(iVar8 * 0x10 + iVar4 * -0x10) >> 4;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = uStack_67;
      __comp_01._M_comp.desc = bVar3;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::hugeint_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>>
                (v_t + iVar4,v_t + iVar9,v_t + iVar8,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar4 = this->FRN;
    }
    _Var12._M_p = (pointer)accessor->median->lower;
    hugeint_t::operator-(v_t + iVar4,(hugeint_t *)&stack0xffffffffffffff88);
    hVar10.upper = (int64_t)_Var12._M_p;
    hVar10.lower = in_stack_ffffffffffffff80;
    hVar10 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar10);
    input_02.lower = hVar10.upper;
    iVar7 = 0;
    bVar3 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar10,&local_58,false);
    if (!bVar3) {
      pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_02.upper = iVar7;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                ((string *)&stack0xffffffffffffff88,(duckdb *)hVar10.lower,input_02);
      InvalidInputException::InvalidInputException(pIVar5,(string *)&stack0xffffffffffffff88);
      __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48.lower = local_58.lower;
    local_48.upper = local_58.upper;
    _Var12._M_p = (pointer)accessor->median->lower;
    hugeint_t::operator-(v_t + this->CRN,(hugeint_t *)&stack0xffffffffffffff88);
    input_00.upper = (int64_t)_Var12._M_p;
    input_00.lower = in_stack_ffffffffffffff80;
    hVar10 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input_00);
    input_03.lower = hVar10.upper;
    iVar7 = 0;
    bVar3 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar10,&local_58,false);
    if (!bVar3) {
      pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_03.upper = iVar7;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                ((string *)&stack0xffffffffffffff88,(duckdb *)hVar10.lower,input_03);
      InvalidInputException::InvalidInputException(pIVar5,(string *)&stack0xffffffffffffff88);
      __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    hVar11 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                       (&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (hugeint_t *)&stack0xffffffffffffff88);
  }
  return hVar11;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}